

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct64_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i alVar12;
  undefined1 (*pauVar13) [32];
  undefined1 *puVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  __m256i cospim32;
  __m256i cospi32;
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i rnding;
  __m256i cospim48;
  __m256i cospim16;
  __m256i cospi48;
  __m256i cospi16;
  undefined1 local_c00 [32];
  int local_b20;
  int iStack_b1c;
  int iStack_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int iStack_b08;
  int iStack_b04;
  int local_b00;
  int iStack_afc;
  int iStack_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int iStack_ae8;
  int iStack_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  __m256i local_a80;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  int local_9c0;
  int iStack_9bc;
  int iStack_9b8;
  int iStack_9b4;
  int iStack_9b0;
  int iStack_9ac;
  int iStack_9a8;
  int iStack_9a4;
  int local_9a0;
  int iStack_99c;
  int iStack_998;
  int iStack_994;
  int iStack_990;
  int iStack_98c;
  int iStack_988;
  int iStack_984;
  int local_980;
  int iStack_97c;
  int iStack_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  int iStack_968;
  int iStack_964;
  int local_960;
  int iStack_95c;
  int iStack_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  int iStack_948;
  int iStack_944;
  int local_940;
  int iStack_93c;
  int iStack_938;
  int iStack_934;
  int iStack_930;
  int iStack_92c;
  int iStack_928;
  int iStack_924;
  int local_920;
  int iStack_91c;
  int iStack_918;
  int iStack_914;
  int iStack_910;
  int iStack_90c;
  int iStack_908;
  int iStack_904;
  int local_900;
  int iStack_8fc;
  int iStack_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int iStack_8e8;
  int iStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  __m256i local_860;
  __m256i local_840;
  longlong local_820;
  longlong lStack_818;
  longlong lStack_810;
  longlong lStack_808;
  longlong local_800;
  longlong lStack_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar18 = (long)bit * 0x100;
  local_980 = 1 << ((char)bit - 1U & 0x1f);
  iVar22 = bd + (uint)(do_cols == 0) * 2;
  local_9c0 = 0x8000;
  if (0xf < iVar22 + 6) {
    local_9c0 = 1 << ((char)iVar22 + 5U & 0x1f);
  }
  local_9a0 = -local_9c0;
  local_9c0 = local_9c0 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x164);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x174);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x17c);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32._16_4_ = uVar1;
  auVar32._20_4_ = uVar1;
  auVar32._24_4_ = uVar1;
  auVar32._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x184);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  local_c00._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x18c);
  local_c00._0_4_ = local_c00._4_4_;
  local_c00._8_4_ = local_c00._4_4_;
  local_c00._12_4_ = local_c00._4_4_;
  local_c00._16_4_ = local_c00._4_4_;
  local_c00._20_4_ = local_c00._4_4_;
  local_c00._24_4_ = local_c00._4_4_;
  local_c00._28_4_ = local_c00._4_4_;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x19c);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  local_900 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1a0);
  local_b00 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1e0);
  local_920 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x220);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x23c);
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  auVar53._16_4_ = uVar1;
  auVar53._20_4_ = uVar1;
  auVar53._24_4_ = uVar1;
  auVar53._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x24c);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37._16_4_ = uVar1;
  auVar37._20_4_ = uVar1;
  auVar37._24_4_ = uVar1;
  auVar37._28_4_ = uVar1;
  local_940 = -local_900;
  local_b20 = -local_b00;
  local_960 = -local_920;
  alVar12 = *in;
  pauVar13 = &local_380;
  local_860[0] = alVar12[0];
  local_860[1] = alVar12[1];
  local_860[2] = alVar12[2];
  local_860[3] = alVar12[3];
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x25c);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar62._16_4_ = uVar1;
  auVar62._20_4_ = uVar1;
  auVar62._24_4_ = uVar1;
  auVar62._28_4_ = uVar1;
  iVar22 = -*(int *)((long)vert_filter_length_chroma + lVar18 + 0x224);
  auVar2 = vpmulld_avx2(auVar25,(undefined1  [32])in[1]);
  auVar3 = vpmulld_avx2(auVar62,(undefined1  [32])in[1]);
  auVar63._4_4_ = iVar22;
  auVar63._0_4_ = iVar22;
  auVar63._8_4_ = iVar22;
  auVar63._12_4_ = iVar22;
  auVar63._16_4_ = iVar22;
  auVar63._20_4_ = iVar22;
  auVar63._24_4_ = iVar22;
  auVar63._28_4_ = iVar22;
  iVar22 = -*(int *)((long)vert_filter_length_chroma + lVar18 + 0x234);
  auVar25 = vpmulld_avx2(auVar63,(undefined1  [32])in[0xf]);
  auVar28 = vpmulld_avx2(auVar49,(undefined1  [32])in[0xf]);
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar18 + 0x244);
  auVar50._4_4_ = iVar22;
  auVar50._0_4_ = iVar22;
  auVar50._8_4_ = iVar22;
  auVar50._12_4_ = iVar22;
  auVar50._16_4_ = iVar22;
  auVar50._20_4_ = iVar22;
  auVar50._24_4_ = iVar22;
  auVar50._28_4_ = iVar22;
  auVar29 = vpmulld_avx2(auVar40,(undefined1  [32])in[9]);
  auVar30 = vpmulld_avx2(auVar53,(undefined1  [32])in[9]);
  auVar61._4_4_ = iVar15;
  auVar61._0_4_ = iVar15;
  auVar61._8_4_ = iVar15;
  auVar61._12_4_ = iVar15;
  auVar61._16_4_ = iVar15;
  auVar61._20_4_ = iVar15;
  auVar61._24_4_ = iVar15;
  auVar61._28_4_ = iVar15;
  iVar22 = -*(int *)((long)vert_filter_length_chroma + lVar18 + 0x254);
  auVar31 = vpmulld_avx2(auVar61,(undefined1  [32])in[7]);
  auVar26 = vpmulld_avx2(auVar32,(undefined1  [32])in[7]);
  auVar27 = vpmulld_avx2(auVar27,(undefined1  [32])in[5]);
  auVar32 = vpmulld_avx2(auVar37,(undefined1  [32])in[5]);
  auVar7._4_4_ = local_980;
  auVar7._0_4_ = local_980;
  auVar7._8_4_ = local_980;
  auVar7._12_4_ = local_980;
  auVar7._16_4_ = local_980;
  auVar7._20_4_ = local_980;
  auVar7._24_4_ = local_980;
  auVar7._28_4_ = local_980;
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_80 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar33._4_4_ = iVar22;
  auVar33._0_4_ = iVar22;
  auVar33._8_4_ = iVar22;
  auVar33._12_4_ = iVar22;
  auVar33._16_4_ = iVar22;
  auVar33._20_4_ = iVar22;
  auVar33._24_4_ = iVar22;
  auVar33._28_4_ = iVar22;
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_460 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpaddd_avx2(auVar25,auVar7);
  auVar66 = ZEXT416((uint)bit);
  local_400 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar28,auVar7);
  local_e0 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar29,auVar7);
  local_100 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar30,auVar7);
  local_3e0 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar31,auVar7);
  auVar66 = ZEXT416((uint)bit);
  local_380 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar26,auVar7);
  local_160 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar27,auVar7);
  local_180 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar32,auVar7);
  local_360 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpmulld_avx2(auVar50,(undefined1  [32])in[0xb]);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_300 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xb],local_c00);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_1e0 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpmulld_avx2((undefined1  [32])in[3],auVar33);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x16c);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[3],auVar38);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_280 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  auVar67 = ZEXT416((uint)bit);
  local_260 = vpsrad_avx2(auVar2,auVar67);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x194);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xd],auVar28);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x22c);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xd],auVar39);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_200 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_2e0 = vpsrad_avx2(auVar2,auVar67);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x168);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  auVar2 = vpmulld_avx2((undefined1  [32])in[2],auVar34);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 600);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[2],auVar41);
  iVar22 = -*(int *)((long)vert_filter_length_chroma + lVar18 + 0x228);
  auVar42._4_4_ = iVar22;
  auVar42._0_4_ = iVar22;
  auVar42._8_4_ = iVar22;
  auVar42._12_4_ = iVar22;
  auVar42._16_4_ = iVar22;
  auVar42._20_4_ = iVar22;
  auVar42._24_4_ = iVar22;
  auVar42._28_4_ = iVar22;
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_480 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_8c0 = vpsrad_avx2(auVar2,auVar67);
  local_660 = local_8c0;
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xe],auVar42);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x198);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xe],auVar43);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_600 = vpsrad_avx2(auVar2,auVar67);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_4e0 = vpsrad_avx2(auVar2,auVar67);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x188);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  auVar2 = vpmulld_avx2((undefined1  [32])in[10],auVar35);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x238);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar44._16_4_ = uVar1;
  auVar44._20_4_ = uVar1;
  auVar44._24_4_ = uVar1;
  auVar44._28_4_ = uVar1;
  auVar3 = vpmulld_avx2((undefined1  [32])in[10],auVar44);
  iVar22 = -*(int *)((long)vert_filter_length_chroma + lVar18 + 0x248);
  auVar29._4_4_ = iVar22;
  auVar29._0_4_ = iVar22;
  auVar29._8_4_ = iVar22;
  auVar29._12_4_ = iVar22;
  auVar29._16_4_ = iVar22;
  auVar29._20_4_ = iVar22;
  auVar29._24_4_ = iVar22;
  auVar29._28_4_ = iVar22;
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_500 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(auVar3,auVar7);
  local_5e0 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpmulld_avx2((undefined1  [32])in[6],auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_580 = vpsrad_avx2(auVar2,auVar66);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar18 + 0x178);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  auVar2 = vpmulld_avx2((undefined1  [32])in[6],auVar30);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_560 = vpsrad_avx2(auVar2,auVar66);
  iVar22 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x170);
  local_8a0._4_4_ = iVar22;
  local_8a0._0_4_ = iVar22;
  local_8a0._8_4_ = iVar22;
  local_8a0._12_4_ = iVar22;
  local_8a0._16_4_ = iVar22;
  local_8a0._20_4_ = iVar22;
  local_8a0._24_4_ = iVar22;
  local_8a0._28_4_ = iVar22;
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar18 + 400);
  local_880._4_4_ = iVar15;
  local_880._0_4_ = iVar15;
  local_880._8_4_ = iVar15;
  local_880._12_4_ = iVar15;
  local_880._16_4_ = iVar15;
  local_880._20_4_ = iVar15;
  local_880._24_4_ = iVar15;
  local_880._28_4_ = iVar15;
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x230);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x250);
  local_8e0._4_4_ = iVar20;
  local_8e0._0_4_ = iVar20;
  local_8e0._8_4_ = iVar20;
  local_8e0._12_4_ = iVar20;
  local_8e0._16_4_ = iVar20;
  local_8e0._20_4_ = iVar20;
  local_8e0._24_4_ = iVar20;
  local_8e0._28_4_ = iVar20;
  iVar24 = -iVar16;
  auVar64._4_4_ = iVar24;
  auVar64._0_4_ = iVar24;
  auVar64._8_4_ = iVar24;
  auVar64._12_4_ = iVar24;
  auVar64._16_4_ = iVar24;
  auVar64._20_4_ = iVar24;
  auVar64._24_4_ = iVar24;
  auVar64._28_4_ = iVar24;
  auVar2 = vpmulld_avx2((undefined1  [32])in[4],local_8a0);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_680 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpmulld_avx2((undefined1  [32])in[4],local_8e0);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_760 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xc],auVar64);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_700 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpmulld_avx2((undefined1  [32])in[0xc],local_880);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_6e0 = vpsrad_avx2(auVar2,auVar66);
  iVar22 = -iVar22;
  auVar57._4_4_ = iVar22;
  auVar57._0_4_ = iVar22;
  auVar57._8_4_ = iVar22;
  auVar57._12_4_ = iVar22;
  auVar57._16_4_ = iVar22;
  auVar57._20_4_ = iVar22;
  auVar57._24_4_ = iVar22;
  auVar57._28_4_ = iVar22;
  auVar2 = vpmulld_avx2(auVar57,local_460);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  auVar3 = vpmulld_avx2(local_8e0,local_80);
  local_ae0 = vpaddd_avx2(auVar2,auVar3);
  iVar20 = -iVar20;
  auVar45._4_4_ = iVar20;
  auVar45._0_4_ = iVar20;
  auVar45._8_4_ = iVar20;
  auVar45._12_4_ = iVar20;
  auVar45._16_4_ = iVar20;
  auVar45._20_4_ = iVar20;
  auVar45._24_4_ = iVar20;
  auVar45._28_4_ = iVar20;
  auVar3 = vpmulld_avx2(local_400,auVar45);
  auVar2 = vpmulld_avx2(local_e0,auVar57);
  auVar2 = vpaddd_avx2(auVar7,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  iVar22 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1d0);
  auVar51._4_4_ = iVar22;
  auVar51._0_4_ = iVar22;
  auVar51._8_4_ = iVar22;
  auVar51._12_4_ = iVar22;
  auVar51._16_4_ = iVar22;
  auVar51._20_4_ = iVar22;
  auVar51._24_4_ = iVar22;
  auVar51._28_4_ = iVar22;
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1f0);
  iVar24 = -iVar20;
  auVar59._4_4_ = iVar24;
  auVar59._0_4_ = iVar24;
  auVar59._8_4_ = iVar24;
  auVar59._12_4_ = iVar24;
  auVar59._16_4_ = iVar24;
  auVar59._20_4_ = iVar24;
  auVar59._24_4_ = iVar24;
  auVar59._28_4_ = iVar24;
  auVar3 = vpmulld_avx2(local_3e0,auVar59);
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar25 = vpmulld_avx2(local_100,auVar51);
  auVar3 = vpaddd_avx2(auVar3,auVar25);
  iVar22 = -iVar22;
  auVar47._4_4_ = iVar22;
  auVar47._0_4_ = iVar22;
  auVar47._8_4_ = iVar22;
  auVar47._12_4_ = iVar22;
  auVar47._16_4_ = iVar22;
  auVar47._20_4_ = iVar22;
  auVar47._24_4_ = iVar22;
  auVar47._28_4_ = iVar22;
  auVar28 = vpmulld_avx2(local_380,auVar47);
  auVar25 = vpmulld_avx2(local_160,auVar59);
  auVar25 = vpaddd_avx2(auVar25,auVar7);
  auVar25 = vpaddd_avx2(auVar25,auVar28);
  auVar29 = vpmulld_avx2(local_380,auVar59);
  auVar28 = vpmulld_avx2(local_160,auVar51);
  auVar28 = vpaddd_avx2(auVar28,auVar7);
  auVar28 = vpaddd_avx2(auVar29,auVar28);
  local_140 = vpsrad_avx2(auVar28,auVar66);
  auVar28 = vpmulld_avx2(local_3e0,auVar51);
  auVar54._4_4_ = iVar20;
  auVar54._0_4_ = iVar20;
  auVar54._8_4_ = iVar20;
  auVar54._12_4_ = iVar20;
  auVar54._16_4_ = iVar20;
  auVar54._20_4_ = iVar20;
  auVar54._24_4_ = iVar20;
  auVar54._28_4_ = iVar20;
  auVar29 = vpmulld_avx2(local_100,auVar54);
  auVar28 = vpaddd_avx2(auVar28,auVar7);
  auVar28 = vpaddd_avx2(auVar28,auVar29);
  local_120 = vpsrad_avx2(auVar28,auVar66);
  auVar29 = vpmulld_avx2(local_400,auVar57);
  auVar28 = vpmulld_avx2(local_e0,local_8e0);
  auVar28 = vpaddd_avx2(auVar28,auVar7);
  auVar28 = vpaddd_avx2(auVar28,auVar29);
  local_c0 = vpsrad_avx2(auVar28,auVar66);
  auVar28 = vpmulld_avx2(local_8e0,local_460);
  auVar29 = vpmulld_avx2(local_8a0,local_80);
  iVar22 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1b0);
  auVar28 = vpaddd_avx2(auVar28,auVar7);
  auVar28 = vpaddd_avx2(auVar28,auVar29);
  local_a0 = vpsrad_avx2(auVar28,auVar66);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x210);
  auVar52._4_4_ = iVar20;
  auVar52._0_4_ = iVar20;
  auVar52._8_4_ = iVar20;
  auVar52._12_4_ = iVar20;
  auVar52._16_4_ = iVar20;
  auVar52._20_4_ = iVar20;
  auVar52._24_4_ = iVar20;
  auVar52._28_4_ = iVar20;
  iVar24 = -iVar22;
  local_440 = vpsrad_avx2(local_ae0,auVar66);
  auVar55._4_4_ = iVar24;
  auVar55._0_4_ = iVar24;
  auVar55._8_4_ = iVar24;
  auVar55._12_4_ = iVar24;
  auVar55._16_4_ = iVar24;
  auVar55._20_4_ = iVar24;
  auVar55._24_4_ = iVar24;
  auVar55._28_4_ = iVar24;
  local_420 = vpsrad_avx2(auVar2,auVar66);
  local_3c0 = vpsrad_avx2(auVar3,auVar66);
  local_3a0 = vpsrad_avx2(auVar25,auVar66);
  iVar20 = -iVar20;
  auVar2 = vpmulld_avx2(local_360,auVar55);
  auVar3 = vpmulld_avx2(auVar52,local_180);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar46._4_4_ = iVar20;
  auVar46._0_4_ = iVar20;
  auVar46._8_4_ = iVar20;
  auVar46._12_4_ = iVar20;
  auVar46._16_4_ = iVar20;
  auVar46._20_4_ = iVar20;
  auVar46._24_4_ = iVar20;
  auVar46._28_4_ = iVar20;
  auVar3 = vpmulld_avx2(local_300,auVar46);
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar25 = vpmulld_avx2(local_1e0,auVar55);
  auVar3 = vpaddd_avx2(auVar3,auVar25);
  auVar25 = vpmulld_avx2(local_200,local_880);
  auVar25 = vpaddd_avx2(auVar7,auVar25);
  auVar28 = vpmulld_avx2(local_2e0,auVar64);
  auVar25 = vpaddd_avx2(auVar28,auVar25);
  iVar15 = -iVar15;
  auVar65._4_4_ = iVar15;
  auVar65._0_4_ = iVar15;
  auVar65._8_4_ = iVar15;
  auVar65._12_4_ = iVar15;
  auVar65._16_4_ = iVar15;
  auVar65._20_4_ = iVar15;
  auVar65._24_4_ = iVar15;
  auVar65._28_4_ = iVar15;
  auVar28 = vpmulld_avx2(local_280,auVar65);
  auVar28 = vpaddd_avx2(auVar28,auVar7);
  auVar29 = vpmulld_avx2(local_260,auVar64);
  auVar28 = vpaddd_avx2(auVar28,auVar29);
  auVar30 = vpmulld_avx2(local_280,auVar64);
  auVar29 = vpmulld_avx2(local_260,local_880);
  auVar29 = vpaddd_avx2(auVar7,auVar29);
  auVar29 = vpaddd_avx2(auVar30,auVar29);
  local_240 = vpsrad_avx2(auVar29,auVar66);
  auVar29 = vpmulld_avx2(local_2e0,local_880);
  auVar31._4_4_ = iVar16;
  auVar31._0_4_ = iVar16;
  auVar31._8_4_ = iVar16;
  auVar31._12_4_ = iVar16;
  auVar31._16_4_ = iVar16;
  auVar31._20_4_ = iVar16;
  auVar31._24_4_ = iVar16;
  auVar31._28_4_ = iVar16;
  auVar30 = vpmulld_avx2(local_200,auVar31);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_220 = vpsrad_avx2(auVar29,auVar66);
  auVar30 = vpmulld_avx2(local_300,auVar55);
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x180);
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x1c0);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x200);
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar18 + 0x240);
  auVar29 = vpmulld_avx2(local_1e0,auVar52);
  auVar29 = vpaddd_avx2(auVar7,auVar29);
  auVar29 = vpaddd_avx2(auVar30,auVar29);
  iVar21 = -iVar15;
  local_1c0 = vpsrad_avx2(auVar29,auVar66);
  auVar48._4_4_ = iVar22;
  auVar48._0_4_ = iVar22;
  auVar48._8_4_ = iVar22;
  auVar48._12_4_ = iVar22;
  auVar48._16_4_ = iVar22;
  auVar48._20_4_ = iVar22;
  auVar48._24_4_ = iVar22;
  auVar48._28_4_ = iVar22;
  auVar29 = vpmulld_avx2(auVar52,local_360);
  iVar23 = -iVar20;
  auVar30 = vpmulld_avx2(auVar48,local_180);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_1a0 = vpsrad_avx2(auVar29,auVar66);
  iVar22 = -iVar24;
  auVar36._4_4_ = iVar15;
  auVar36._0_4_ = iVar15;
  auVar36._8_4_ = iVar15;
  auVar36._12_4_ = iVar15;
  auVar36._16_4_ = iVar15;
  auVar36._20_4_ = iVar15;
  auVar36._24_4_ = iVar15;
  auVar36._28_4_ = iVar15;
  local_340 = vpsrad_avx2(auVar2,auVar66);
  auVar56._4_4_ = iVar16;
  auVar56._0_4_ = iVar16;
  auVar56._8_4_ = iVar16;
  auVar56._12_4_ = iVar16;
  auVar56._16_4_ = iVar16;
  auVar56._20_4_ = iVar16;
  auVar56._24_4_ = iVar16;
  auVar56._28_4_ = iVar16;
  auVar58._4_4_ = iVar24;
  auVar58._0_4_ = iVar24;
  auVar58._8_4_ = iVar24;
  auVar58._12_4_ = iVar24;
  auVar58._16_4_ = iVar24;
  auVar58._20_4_ = iVar24;
  auVar58._24_4_ = iVar24;
  auVar58._28_4_ = iVar24;
  local_a00._4_4_ = iVar21;
  local_a00._0_4_ = iVar21;
  local_a00._8_4_ = iVar21;
  local_a00._12_4_ = iVar21;
  local_a00._16_4_ = iVar21;
  local_a00._20_4_ = iVar21;
  local_a00._24_4_ = iVar21;
  local_a00._28_4_ = iVar21;
  auVar60._4_4_ = iVar23;
  auVar60._0_4_ = iVar23;
  auVar60._8_4_ = iVar23;
  auVar60._12_4_ = iVar23;
  auVar60._16_4_ = iVar23;
  auVar60._20_4_ = iVar23;
  auVar60._24_4_ = iVar23;
  auVar60._28_4_ = iVar23;
  local_320 = vpsrad_avx2(auVar3,auVar66);
  local_2c0 = vpsrad_avx2(auVar25,auVar66);
  local_a40._4_4_ = iVar22;
  local_a40._0_4_ = iVar22;
  local_a40._8_4_ = iVar22;
  local_a40._12_4_ = iVar22;
  local_a40._16_4_ = iVar22;
  local_a40._20_4_ = iVar22;
  local_a40._24_4_ = iVar22;
  local_a40._28_4_ = iVar22;
  local_2a0 = vpsrad_avx2(auVar28,auVar66);
  auVar2 = vpmulld_avx2((undefined1  [32])in[8],auVar36);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_780 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpmulld_avx2((undefined1  [32])in[8],auVar58);
  auVar2 = vpaddd_avx2(auVar2,auVar7);
  local_7e0 = vpsrad_avx2(auVar2,auVar66);
  local_740 = local_760;
  local_720 = local_700;
  local_6c0 = local_6e0;
  local_6a0 = local_680;
  auVar3 = vpmulld_avx2(local_8c0,local_a00);
  auVar2 = vpmulld_avx2(local_480,auVar58);
  auVar2 = vpaddd_avx2(auVar7,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_600,local_a40);
  auVar25 = vpmulld_avx2(local_4e0,local_a00);
  auVar3 = vpaddd_avx2(auVar3,auVar7);
  auVar3 = vpaddd_avx2(auVar25,auVar3);
  auVar25 = vpmulld_avx2(local_500,auVar56);
  auVar25 = vpaddd_avx2(auVar25,auVar7);
  auVar28 = vpmulld_avx2(local_5e0,auVar60);
  auVar25 = vpaddd_avx2(auVar28,auVar25);
  iVar16 = -iVar16;
  auVar26._4_4_ = iVar16;
  auVar26._0_4_ = iVar16;
  auVar26._8_4_ = iVar16;
  auVar26._12_4_ = iVar16;
  auVar26._16_4_ = iVar16;
  auVar26._20_4_ = iVar16;
  auVar26._24_4_ = iVar16;
  auVar26._28_4_ = iVar16;
  auVar28 = vpmulld_avx2(local_580,auVar26);
  auVar28 = vpaddd_avx2(auVar28,auVar7);
  auVar29 = vpmulld_avx2(local_560,auVar60);
  auVar28 = vpaddd_avx2(auVar28,auVar29);
  auVar30 = vpmulld_avx2(local_580,auVar60);
  auVar29 = vpmulld_avx2(local_560,auVar56);
  auVar29 = vpaddd_avx2(auVar7,auVar29);
  auVar29 = vpaddd_avx2(auVar30,auVar29);
  local_540 = vpsrad_avx2(auVar29,auVar66);
  local_9e0._4_4_ = iVar20;
  local_9e0._0_4_ = iVar20;
  local_9e0._8_4_ = iVar20;
  local_9e0._12_4_ = iVar20;
  local_9e0._16_4_ = iVar20;
  local_9e0._20_4_ = iVar20;
  local_9e0._24_4_ = iVar20;
  local_9e0._28_4_ = iVar20;
  auVar29 = vpmulld_avx2(local_5e0,auVar56);
  auVar30 = vpmulld_avx2(local_500,local_9e0);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  auVar31 = vpmulld_avx2(local_600,local_a00);
  auVar30 = vpmulld_avx2(local_4e0,auVar58);
  auVar30 = vpaddd_avx2(auVar7,auVar30);
  auVar30 = vpaddd_avx2(auVar31,auVar30);
  local_520 = vpsrad_avx2(auVar29,auVar66);
  local_4c0 = vpsrad_avx2(auVar30,auVar66);
  auVar29 = vpmulld_avx2(auVar58,local_8c0);
  auVar30 = vpmulld_avx2(local_480,auVar36);
  auVar29 = vpaddd_avx2(auVar29,auVar7);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_4a0 = vpsrad_avx2(auVar29,auVar66);
  local_640 = vpsrad_avx2(auVar2,auVar66);
  local_620 = vpsrad_avx2(auVar3,auVar66);
  local_5c0 = vpsrad_avx2(auVar25,auVar66);
  local_5a0 = vpsrad_avx2(auVar28,auVar66);
  auVar3._4_4_ = local_9a0;
  auVar3._0_4_ = local_9a0;
  auVar3._8_4_ = local_9a0;
  auVar3._12_4_ = local_9a0;
  auVar3._16_4_ = local_9a0;
  auVar3._20_4_ = local_9a0;
  auVar3._24_4_ = local_9a0;
  auVar3._28_4_ = local_9a0;
  auVar2._4_4_ = local_9c0;
  auVar2._0_4_ = local_9c0;
  auVar2._8_4_ = local_9c0;
  auVar2._12_4_ = local_9c0;
  auVar2._16_4_ = local_9c0;
  auVar2._20_4_ = local_9c0;
  auVar2._24_4_ = local_9c0;
  auVar2._28_4_ = local_9c0;
  for (uVar17 = 0x20; uVar17 < 0x40; uVar17 = uVar17 + 8) {
    auVar25 = vpaddd_avx2(pauVar13[-4],pauVar13[-7]);
    auVar29 = vpsubd_avx2(pauVar13[-7],pauVar13[-4]);
    auVar25 = vpmaxsd_avx2(auVar25,auVar3);
    auVar28 = vpminsd_avx2(auVar25,auVar2);
    auVar25 = vpmaxsd_avx2(auVar29,auVar3);
    auVar25 = vpminsd_avx2(auVar25,auVar2);
    pauVar13[-7] = auVar28;
    pauVar13[-4] = auVar25;
    auVar25 = vpaddd_avx2(pauVar13[-5],pauVar13[-6]);
    auVar29 = vpsubd_avx2(pauVar13[-6],pauVar13[-5]);
    auVar25 = vpmaxsd_avx2(auVar25,auVar3);
    auVar28 = vpminsd_avx2(auVar25,auVar2);
    auVar25 = vpmaxsd_avx2(auVar29,auVar3);
    auVar25 = vpminsd_avx2(auVar25,auVar2);
    pauVar13[-6] = auVar28;
    pauVar13[-5] = auVar25;
    auVar25 = vpaddd_avx2(pauVar13[-3],*pauVar13);
    auVar29 = vpsubd_avx2(*pauVar13,pauVar13[-3]);
    auVar25 = vpmaxsd_avx2(auVar25,auVar3);
    auVar28 = vpminsd_avx2(auVar25,auVar2);
    auVar25 = vpmaxsd_avx2(auVar29,auVar3);
    auVar25 = vpminsd_avx2(auVar25,auVar2);
    *pauVar13 = auVar28;
    pauVar13[-3] = auVar25;
    auVar25 = vpaddd_avx2(pauVar13[-2],pauVar13[-1]);
    auVar29 = vpsubd_avx2(pauVar13[-1],pauVar13[-2]);
    auVar25 = vpmaxsd_avx2(auVar25,auVar3);
    auVar28 = vpminsd_avx2(auVar25,auVar2);
    auVar25 = vpmaxsd_avx2(auVar29,auVar3);
    auVar25 = vpminsd_avx2(auVar25,auVar2);
    pauVar13[-1] = auVar28;
    pauVar13[-2] = auVar25;
    pauVar13 = pauVar13 + 8;
  }
  local_a60._4_4_ = local_b00;
  local_a60._0_4_ = local_b00;
  local_a60._8_4_ = local_b00;
  local_a60._12_4_ = local_b00;
  local_a60._16_4_ = local_b00;
  local_a60._20_4_ = local_b00;
  local_a60._24_4_ = local_b00;
  local_a60._28_4_ = local_b00;
  pauVar13 = &local_580;
  auVar25 = vpmulld_avx2(local_a60,(undefined1  [32])alVar12);
  auVar25 = vpaddd_avx2(auVar25,auVar7);
  local_a80 = (__m256i)vpsrad_avx2(auVar25,auVar66);
  local_840[0] = local_a80[0];
  local_840[1] = local_a80[1];
  local_840[2] = local_a80[2];
  local_840[3] = local_a80[3];
  local_860[0] = local_a80[0];
  local_860[1] = local_a80[1];
  local_860[2] = local_a80[2];
  local_860[3] = local_a80[3];
  local_7c0 = local_7e0;
  local_7a0 = local_780;
  auVar9._4_4_ = local_940;
  auVar9._0_4_ = local_940;
  auVar9._8_4_ = local_940;
  auVar9._12_4_ = local_940;
  auVar9._16_4_ = local_940;
  auVar9._20_4_ = local_940;
  auVar9._24_4_ = local_940;
  auVar9._28_4_ = local_940;
  auVar25 = vpmulld_avx2(local_760,auVar9);
  auVar10._4_4_ = local_920;
  auVar10._0_4_ = local_920;
  auVar10._8_4_ = local_920;
  auVar10._12_4_ = local_920;
  auVar10._16_4_ = local_920;
  auVar10._20_4_ = local_920;
  auVar10._24_4_ = local_920;
  auVar10._28_4_ = local_920;
  auVar28 = vpmulld_avx2(local_680,auVar10);
  auVar25 = vpaddd_avx2(auVar25,auVar7);
  auVar25 = vpaddd_avx2(auVar28,auVar25);
  local_740 = vpsrad_avx2(auVar25,auVar66);
  auVar25 = vpmulld_avx2(auVar10,local_760);
  auVar11._4_4_ = local_900;
  auVar11._0_4_ = local_900;
  auVar11._8_4_ = local_900;
  auVar11._12_4_ = local_900;
  auVar11._16_4_ = local_900;
  auVar11._20_4_ = local_900;
  auVar11._24_4_ = local_900;
  auVar11._28_4_ = local_900;
  auVar28 = vpmulld_avx2(auVar11,local_680);
  auVar25 = vpaddd_avx2(auVar25,auVar7);
  auVar25 = vpaddd_avx2(auVar25,auVar28);
  local_6a0 = vpsrad_avx2(auVar25,auVar66);
  local_a20._4_4_ = local_960;
  local_a20._0_4_ = local_960;
  local_a20._8_4_ = local_960;
  local_a20._12_4_ = local_960;
  local_a20._16_4_ = local_960;
  local_a20._20_4_ = local_960;
  local_a20._24_4_ = local_960;
  local_a20._28_4_ = local_960;
  auVar25 = vpmulld_avx2(local_700,local_a20);
  auVar28 = vpmulld_avx2(local_6e0,auVar9);
  auVar25 = vpaddd_avx2(auVar25,auVar7);
  auVar25 = vpaddd_avx2(auVar25,auVar28);
  local_720 = vpsrad_avx2(auVar25,auVar66);
  auVar25 = vpmulld_avx2(local_700,auVar9);
  auVar28 = vpmulld_avx2(local_6e0,auVar10);
  auVar25 = vpaddd_avx2(auVar25,auVar7);
  auVar25 = vpaddd_avx2(auVar25,auVar28);
  local_6c0 = vpsrad_avx2(auVar25,auVar66);
  for (uVar17 = 0x10; uVar17 < 0x20; uVar17 = uVar17 + 8) {
    auVar25 = vpaddd_avx2(pauVar13[-4],pauVar13[-7]);
    auVar29 = vpsubd_avx2(pauVar13[-7],pauVar13[-4]);
    auVar25 = vpmaxsd_avx2(auVar25,auVar3);
    auVar28 = vpminsd_avx2(auVar25,auVar2);
    auVar25 = vpmaxsd_avx2(auVar29,auVar3);
    auVar25 = vpminsd_avx2(auVar25,auVar2);
    pauVar13[-7] = auVar28;
    pauVar13[-4] = auVar25;
    auVar25 = vpaddd_avx2(pauVar13[-5],pauVar13[-6]);
    auVar29 = vpsubd_avx2(pauVar13[-6],pauVar13[-5]);
    auVar25 = vpmaxsd_avx2(auVar25,auVar3);
    auVar28 = vpminsd_avx2(auVar25,auVar2);
    auVar25 = vpmaxsd_avx2(auVar29,auVar3);
    auVar25 = vpminsd_avx2(auVar25,auVar2);
    pauVar13[-6] = auVar28;
    pauVar13[-5] = auVar25;
    auVar25 = vpaddd_avx2(pauVar13[-3],*pauVar13);
    auVar29 = vpsubd_avx2(*pauVar13,pauVar13[-3]);
    auVar25 = vpmaxsd_avx2(auVar25,auVar3);
    auVar28 = vpminsd_avx2(auVar25,auVar2);
    auVar25 = vpmaxsd_avx2(auVar29,auVar3);
    auVar25 = vpminsd_avx2(auVar25,auVar2);
    *pauVar13 = auVar28;
    pauVar13[-3] = auVar25;
    auVar25 = vpaddd_avx2(pauVar13[-2],pauVar13[-1]);
    auVar29 = vpsubd_avx2(pauVar13[-1],pauVar13[-2]);
    auVar25 = vpmaxsd_avx2(auVar25,auVar3);
    auVar28 = vpminsd_avx2(auVar25,auVar2);
    auVar25 = vpmaxsd_avx2(auVar29,auVar3);
    auVar25 = vpminsd_avx2(auVar25,auVar2);
    pauVar13[-1] = auVar28;
    pauVar13[-2] = auVar25;
    pauVar13 = pauVar13 + 8;
  }
  puVar14 = local_460;
  auVar2 = vpmulld_avx2(local_420,local_a00);
  auVar3 = vpmulld_avx2(local_c0,auVar58);
  local_aa0 = vpaddd_avx2(auVar3,auVar2);
  auVar8._4_4_ = local_980;
  auVar8._0_4_ = local_980;
  auVar8._8_4_ = local_980;
  auVar8._12_4_ = local_980;
  auVar8._16_4_ = local_980;
  auVar8._20_4_ = local_980;
  auVar8._24_4_ = local_980;
  auVar8._28_4_ = local_980;
  auVar2 = vpmulld_avx2(local_400,local_a00);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar3 = vpmulld_avx2(local_e0,auVar58);
  local_ac0 = vpaddd_avx2(auVar2,auVar3);
  auVar2 = vpmulld_avx2(local_3e0,local_a40);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar3 = vpmulld_avx2(local_100,local_a00);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_3c0,local_a40);
  auVar3 = vpaddd_avx2(auVar8,auVar3);
  auVar25 = vpmulld_avx2(local_120,local_a00);
  auVar3 = vpaddd_avx2(auVar25,auVar3);
  auVar25 = vpmulld_avx2(local_3c0,local_a00);
  auVar28 = vpmulld_avx2(local_120,auVar58);
  auVar25 = vpaddd_avx2(auVar8,auVar25);
  auVar25 = vpaddd_avx2(auVar25,auVar28);
  local_120 = vpsrad_avx2(auVar25,auVar66);
  auVar25 = vpmulld_avx2(local_3e0,local_a00);
  auVar28 = vpmulld_avx2(local_100,auVar58);
  auVar25 = vpaddd_avx2(auVar8,auVar25);
  auVar25 = vpaddd_avx2(auVar25,auVar28);
  auVar28 = vpmulld_avx2(local_400,auVar58);
  auVar29 = vpmulld_avx2(local_e0,auVar36);
  auVar28 = vpaddd_avx2(auVar8,auVar28);
  auVar28 = vpaddd_avx2(auVar28,auVar29);
  local_100 = vpsrad_avx2(auVar25,auVar66);
  local_e0 = vpsrad_avx2(auVar28,auVar66);
  auVar25 = vpmulld_avx2(local_420,auVar58);
  auVar28 = vpmulld_avx2(local_c0,auVar36);
  auVar25 = vpaddd_avx2(auVar28,auVar25);
  auVar25 = vpaddd_avx2(auVar8,auVar25);
  local_c0 = vpsrad_avx2(auVar25,auVar66);
  auVar25 = vpaddd_avx2(auVar8,local_aa0);
  local_420 = vpsrad_avx2(auVar25,auVar66);
  local_400 = vpsrad_avx2(local_ac0,auVar66);
  local_3e0 = vpsrad_avx2(auVar2,auVar66);
  local_3c0 = vpsrad_avx2(auVar3,auVar66);
  auVar2 = vpmulld_avx2(local_320,auVar60);
  auVar3 = vpmulld_avx2(local_1c0,auVar56);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_300,auVar60);
  auVar3 = vpaddd_avx2(auVar8,auVar3);
  auVar25 = vpmulld_avx2(local_1e0,auVar56);
  auVar3 = vpaddd_avx2(auVar3,auVar25);
  auVar25 = vpmulld_avx2(local_2e0,auVar26);
  auVar25 = vpaddd_avx2(auVar8,auVar25);
  auVar28 = vpmulld_avx2(local_200,auVar60);
  auVar25 = vpaddd_avx2(auVar28,auVar25);
  auVar28 = vpmulld_avx2(local_2c0,auVar26);
  auVar28 = vpaddd_avx2(auVar28,auVar8);
  auVar29 = vpmulld_avx2(local_220,auVar60);
  auVar28 = vpaddd_avx2(auVar28,auVar29);
  auVar29 = vpmulld_avx2(local_2c0,auVar60);
  auVar30 = vpmulld_avx2(local_220,auVar56);
  auVar29 = vpaddd_avx2(auVar29,auVar8);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_220 = vpsrad_avx2(auVar29,auVar66);
  auVar29 = vpmulld_avx2(local_2e0,auVar60);
  auVar30 = vpmulld_avx2(local_200,auVar56);
  auVar29 = vpaddd_avx2(auVar8,auVar29);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_200 = vpsrad_avx2(auVar29,auVar66);
  auVar29 = vpmulld_avx2(local_300,auVar56);
  auVar30 = vpmulld_avx2(local_1e0,local_9e0);
  auVar29 = vpaddd_avx2(auVar8,auVar29);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  auVar30 = vpsrad_avx2(auVar2,auVar66);
  local_300 = vpsrad_avx2(auVar3,auVar66);
  local_2e0 = vpsrad_avx2(auVar25,auVar66);
  local_2c0 = vpsrad_avx2(auVar28,auVar66);
  auVar2 = vpmulld_avx2(local_320,auVar56);
  local_1e0 = vpsrad_avx2(auVar29,auVar66);
  auVar3 = vpmulld_avx2(local_9e0,local_1c0);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_1c0 = vpsrad_avx2(auVar2,auVar66);
  local_320 = auVar30;
  local_800 = local_a80[0];
  lStack_7f8 = local_a80[1];
  lStack_7f0 = local_a80[2];
  lStack_7e8 = local_a80[3];
  local_820 = local_a80[0];
  lStack_818 = local_a80[1];
  lStack_810 = local_a80[2];
  lStack_808 = local_a80[3];
  auVar4._4_4_ = local_b20;
  auVar4._0_4_ = local_b20;
  auVar4._8_4_ = local_b20;
  auVar4._12_4_ = local_b20;
  auVar4._16_4_ = local_b20;
  auVar4._20_4_ = local_b20;
  auVar4._24_4_ = local_b20;
  auVar4._28_4_ = local_b20;
  auVar2 = vpmulld_avx2(local_7e0,auVar4);
  auVar3 = vpmulld_avx2(local_780,local_a60);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_7c0 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(local_780,local_7e0);
  auVar2 = vpmulld_avx2(auVar2,local_a60);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  local_7a0 = vpsrad_avx2(auVar2,auVar66);
  auVar2 = vpaddd_avx2(local_700,local_760);
  auVar3 = vpsubd_avx2(local_760,local_700);
  auVar6._4_4_ = local_9a0;
  auVar6._0_4_ = local_9a0;
  auVar6._8_4_ = local_9a0;
  auVar6._12_4_ = local_9a0;
  auVar6._16_4_ = local_9a0;
  auVar6._20_4_ = local_9a0;
  auVar6._24_4_ = local_9a0;
  auVar6._28_4_ = local_9a0;
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  auVar5._4_4_ = local_9c0;
  auVar5._0_4_ = local_9c0;
  auVar5._8_4_ = local_9c0;
  auVar5._12_4_ = local_9c0;
  auVar5._16_4_ = local_9c0;
  auVar5._20_4_ = local_9c0;
  auVar5._24_4_ = local_9c0;
  auVar5._28_4_ = local_9c0;
  local_760 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_700 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_720,local_740);
  auVar3 = vpsubd_avx2(local_740,local_720);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_740 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_720 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_6e0,local_680);
  auVar3 = vpsubd_avx2(local_680,local_6e0);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_680 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_6e0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_6c0,local_6a0);
  auVar3 = vpsubd_avx2(local_6a0,local_6c0);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_6a0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_6c0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmulld_avx2(local_620,auVar9);
  auVar3 = vpmulld_avx2(local_4c0,auVar10);
  auVar2 = vpaddd_avx2(auVar8,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_600,auVar9);
  auVar25 = vpmulld_avx2(local_4e0,auVar10);
  auVar3 = vpaddd_avx2(auVar8,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar25);
  auVar25 = vpmulld_avx2(local_5e0,local_a20);
  auVar25 = vpaddd_avx2(auVar8,auVar25);
  auVar28 = vpmulld_avx2(local_500,auVar9);
  auVar25 = vpaddd_avx2(auVar28,auVar25);
  auVar29 = vpmulld_avx2(local_5c0,local_a20);
  auVar28 = vpmulld_avx2(local_5c0,auVar9);
  auVar28 = vpaddd_avx2(auVar8,auVar28);
  auVar30 = vpmulld_avx2(local_520,auVar10);
  auVar28 = vpaddd_avx2(auVar30,auVar28);
  auVar30 = vpmulld_avx2(local_520,auVar9);
  auVar29 = vpaddd_avx2(auVar29,auVar8);
  local_520 = vpsrad_avx2(auVar28,auVar66);
  auVar28 = vpaddd_avx2(auVar29,auVar30);
  auVar29 = vpmulld_avx2(local_5e0,auVar9);
  auVar30 = vpmulld_avx2(local_500,auVar10);
  auVar29 = vpaddd_avx2(auVar8,auVar29);
  auVar29 = vpaddd_avx2(auVar30,auVar29);
  local_500 = vpsrad_avx2(auVar29,auVar66);
  auVar29 = vpmulld_avx2(local_600,auVar10);
  auVar30 = vpmulld_avx2(local_4e0,auVar11);
  auVar29 = vpaddd_avx2(auVar8,auVar29);
  auVar29 = vpaddd_avx2(auVar30,auVar29);
  local_4e0 = vpsrad_avx2(auVar29,auVar66);
  auVar29 = vpmulld_avx2(auVar10,local_620);
  auVar30 = vpmulld_avx2(auVar11,local_4c0);
  auVar29 = vpaddd_avx2(auVar8,auVar29);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  local_620 = vpsrad_avx2(auVar2,auVar66);
  local_600 = vpsrad_avx2(auVar3,auVar66);
  local_5e0 = vpsrad_avx2(auVar25,auVar66);
  local_5c0 = vpsrad_avx2(auVar28,auVar66);
  local_4c0 = vpsrad_avx2(auVar29,auVar66);
  for (uVar17 = 0x20; (uVar17 & 0xffffffc0) == 0; uVar17 = uVar17 + 0x10) {
    uVar19 = uVar17;
    for (lVar18 = 0; lVar18 != 0x80; lVar18 = lVar18 + 0x20) {
      auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_860 + (uVar19 ^ 7) * 4),
                           *(undefined1 (*) [32])(puVar14 + lVar18));
      auVar25 = vpsubd_avx2(*(undefined1 (*) [32])(puVar14 + lVar18),
                            *(undefined1 (*) [32])(local_860 + (uVar19 ^ 7) * 4));
      auVar2 = vpmaxsd_avx2(auVar2,auVar6);
      auVar3 = vpminsd_avx2(auVar2,auVar5);
      auVar2 = vpmaxsd_avx2(auVar25,auVar6);
      auVar2 = vpminsd_avx2(auVar2,auVar5);
      *(undefined1 (*) [32])(puVar14 + lVar18) = auVar3;
      *(undefined1 (*) [32])(local_860 + (uVar19 ^ 7) * 4) = auVar2;
      auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_860 + (uVar19 ^ 8) * 4),
                           *(undefined1 (*) [32])(local_860 + (uVar19 ^ 0xf) * 4));
      auVar25 = vpsubd_avx2(*(undefined1 (*) [32])(local_860 + (uVar19 ^ 0xf) * 4),
                            *(undefined1 (*) [32])(local_860 + (uVar19 ^ 8) * 4));
      auVar2 = vpmaxsd_avx2(auVar2,auVar6);
      auVar3 = vpminsd_avx2(auVar2,auVar5);
      auVar2 = vpmaxsd_avx2(auVar25,auVar6);
      auVar2 = vpminsd_avx2(auVar2,auVar5);
      *(undefined1 (*) [32])(local_860 + (uVar19 ^ 0xf) * 4) = auVar3;
      *(undefined1 (*) [32])(local_860 + (uVar19 ^ 8) * 4) = auVar2;
      uVar19 = uVar19 + 1;
    }
    puVar14 = puVar14 + 0x200;
  }
  pauVar13 = (undefined1 (*) [32])local_860;
  for (lVar18 = 0xe0; lVar18 != 0x60; lVar18 = lVar18 + -0x20) {
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])((long)local_860 + lVar18),*pauVar13);
    auVar25 = vpsubd_avx2(*pauVar13,*(undefined1 (*) [32])((long)local_860 + lVar18));
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar25,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *pauVar13 = auVar3;
    *(undefined1 (*) [32])((long)local_860 + lVar18) = auVar2;
    pauVar13 = pauVar13 + 1;
  }
  iStack_b1c = local_b20;
  iStack_b18 = local_b20;
  iStack_b14 = local_b20;
  iStack_b10 = local_b20;
  iStack_b0c = local_b20;
  iStack_b08 = local_b20;
  iStack_b04 = local_b20;
  iStack_afc = local_b00;
  iStack_af8 = local_b00;
  iStack_af4 = local_b00;
  iStack_af0 = local_b00;
  iStack_aec = local_b00;
  iStack_ae8 = local_b00;
  iStack_ae4 = local_b00;
  iStack_9bc = local_9c0;
  iStack_9b8 = local_9c0;
  iStack_9b4 = local_9c0;
  iStack_9b0 = local_9c0;
  iStack_9ac = local_9c0;
  iStack_9a8 = local_9c0;
  iStack_9a4 = local_9c0;
  iStack_99c = local_9a0;
  iStack_998 = local_9a0;
  iStack_994 = local_9a0;
  iStack_990 = local_9a0;
  iStack_98c = local_9a0;
  iStack_988 = local_9a0;
  iStack_984 = local_9a0;
  iStack_97c = local_980;
  iStack_978 = local_980;
  iStack_974 = local_980;
  iStack_970 = local_980;
  iStack_96c = local_980;
  iStack_968 = local_980;
  iStack_964 = local_980;
  iStack_95c = local_960;
  iStack_958 = local_960;
  iStack_954 = local_960;
  iStack_950 = local_960;
  iStack_94c = local_960;
  iStack_948 = local_960;
  iStack_944 = local_960;
  iStack_93c = local_940;
  iStack_938 = local_940;
  iStack_934 = local_940;
  iStack_930 = local_940;
  iStack_92c = local_940;
  iStack_928 = local_940;
  iStack_924 = local_940;
  iStack_91c = local_920;
  iStack_918 = local_920;
  iStack_914 = local_920;
  iStack_910 = local_920;
  iStack_90c = local_920;
  iStack_908 = local_920;
  iStack_904 = local_920;
  iStack_8fc = local_900;
  iStack_8f8 = local_900;
  iStack_8f4 = local_900;
  iStack_8f0 = local_900;
  iStack_8ec = local_900;
  iStack_8e8 = local_900;
  iStack_8e4 = local_900;
  idct64_stage8_avx2(&local_860,(__m256i *)&local_b20,(__m256i *)&local_b00,(__m256i *)&local_940,
                     (__m256i *)&local_920,(__m256i *)&local_900,(__m256i *)&local_960,
                     (__m256i *)&local_9a0,(__m256i *)&local_9c0,(__m256i *)&local_980,bit);
  idct64_stage9_avx2(&local_860,(__m256i *)&local_b20,(__m256i *)&local_b00,(__m256i *)&local_9a0,
                     (__m256i *)&local_9c0,(__m256i *)&local_980,bit);
  idct64_stage10_avx2(&local_860,(__m256i *)&local_b20,(__m256i *)&local_b00,(__m256i *)&local_9a0,
                      (__m256i *)&local_9c0,(__m256i *)&local_980,bit);
  idct64_stage11_avx2(&local_860,out,do_cols,bd,out_shift,(__m256i *)&local_9a0,
                      (__m256i *)&local_9c0);
  return;
}

Assistant:

static void idct64_low16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[4] = input[8];
  x[8] = input[4];
  x[12] = input[12];
  x[16] = input[2];
  x[20] = input[10];
  x[24] = input[6];
  x[28] = input[14];
  x[32] = input[1];
  x[36] = input[9];
  x[40] = input[5];
  x[44] = input[13];
  x[48] = input[3];
  x[52] = input[11];
  x[56] = input[7];
  x[60] = input[15];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_w16_0_avx2(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_w16_0_avx2(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[34] = x[35];
  x[37] = x[36];
  x[38] = x[39];
  x[41] = x[40];
  x[42] = x[43];
  x[45] = x[44];
  x[46] = x[47];
  x[49] = x[48];
  x[50] = x[51];
  x[53] = x[52];
  x[54] = x[55];
  x[57] = x[56];
  x[58] = x[59];
  x[61] = x[60];
  x[62] = x[63];

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];
  idct64_stage4_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct64_stage5_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[10], &x[13], _r,
                  INV_COS_BIT);
  idct64_stage6_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, INV_COS_BIT);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}